

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void addPaddingBits(uchar *out,uchar *in,size_t olinebits,size_t ilinebits,uint h)

{
  uchar bit_00;
  size_t sStack_50;
  uchar bit;
  size_t x;
  size_t ibp;
  size_t obp;
  size_t diff;
  uint y;
  uint h_local;
  size_t ilinebits_local;
  size_t olinebits_local;
  uchar *in_local;
  uchar *out_local;
  
  obp = olinebits - ilinebits;
  ibp = 0;
  x = 0;
  diff._4_4_ = h;
  _y = ilinebits;
  ilinebits_local = olinebits;
  olinebits_local = (size_t)in;
  in_local = out;
  for (diff._0_4_ = 0; (uint)diff != diff._4_4_; diff._0_4_ = (uint)diff + 1) {
    for (sStack_50 = 0; sStack_50 < _y; sStack_50 = sStack_50 + 1) {
      bit_00 = readBitFromReversedStream(&x,(uchar *)olinebits_local);
      setBitOfReversedStream(&ibp,in_local,bit_00);
    }
    for (sStack_50 = 0; sStack_50 != obp; sStack_50 = sStack_50 + 1) {
      setBitOfReversedStream(&ibp,in_local,'\0');
    }
  }
  return;
}

Assistant:

static void addPaddingBits(unsigned char* out, const unsigned char* in,
                           size_t olinebits, size_t ilinebits, unsigned h) {
  /*The opposite of the removePaddingBits function
  olinebits must be >= ilinebits*/
  unsigned y;
  size_t diff = olinebits - ilinebits;
  size_t obp = 0, ibp = 0; /*bit pointers*/
  for(y = 0; y != h; ++y) {
    size_t x;
    for(x = 0; x < ilinebits; ++x) {
      unsigned char bit = readBitFromReversedStream(&ibp, in);
      setBitOfReversedStream(&obp, out, bit);
    }
    /*obp += diff; --> no, fill in some value in the padding bits too, to avoid
    "Use of uninitialised value of size ###" warning from valgrind*/
    for(x = 0; x != diff; ++x) setBitOfReversedStream(&obp, out, 0);
  }
}